

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

void Js::RegexHelper::AppendSubString
               (ScriptContext *scriptContext,JavascriptArray *ary,JavascriptString *input,
               CharCount startInclusive,CharCount endExclusive)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  undefined4 *puVar5;
  JavascriptString *newValue;
  char16 *pcVar6;
  BigIndex local_48;
  ScriptContext *local_38;
  
  local_38 = scriptContext;
  if (endExclusive < startInclusive) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5ef,"(endExclusive >= startInclusive)",
                                "endExclusive >= startInclusive");
    if (!bVar3) goto LAB_00d4f52b;
    *puVar5 = 0;
  }
  cVar4 = JavascriptString::GetLength(input);
  if (cVar4 < endExclusive) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5f0,"(endExclusive <= input->GetLength())",
                                "endExclusive <= input->GetLength()");
    if (!bVar3) {
LAB_00d4f52b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  cVar4 = endExclusive - startInclusive;
  if (cVar4 == 0) {
    newValue = JavascriptLibrary::GetEmptyString
                         ((local_38->super_ScriptContextBase).javascriptLibrary);
  }
  else if (cVar4 == 1) {
    pJVar1 = (local_38->super_ScriptContextBase).javascriptLibrary;
    pcVar6 = JavascriptString::GetString(input);
    newValue = CharStringCache::GetStringForChar(&pJVar1->charStringCache,pcVar6[startInclusive]);
  }
  else {
    newValue = SubString::New(input,startInclusive,cVar4);
  }
  JavascriptArray::BigIndex::BigIndex(&local_48,(ary->super_ArrayObject).length);
  JavascriptArray::BigIndex::SetItem(&local_48,ary,newValue);
  return;
}

Assistant:

void RegexHelper::AppendSubString(ScriptContext* scriptContext, JavascriptArray* ary, JavascriptString* input, CharCount startInclusive, CharCount endExclusive)
    {
        Assert(endExclusive >= startInclusive);
        Assert(endExclusive <= input->GetLength());
        CharCount length = endExclusive - startInclusive;
        JavascriptString* subString;
        if (length == 0)
        {
            subString = scriptContext->GetLibrary()->GetEmptyString();
        }
        else if (length == 1)
        {
            subString = scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(input->GetString()[startInclusive]);
        }
        else
        {
            subString = SubString::New(input, startInclusive, length);
        }
        ary->DirectAppendItem(subString);
    }